

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_1>::calcEdgeLogLikelihoodsByPartitionAsync
          (BeagleCPUImpl<double,_1,_1> *this,int *parentBufferIndices,int *childBufferIndices,
          int *probabilityIndices,int *categoryWeightsIndices,int *stateFrequenciesIndices,
          int *cumulativeScaleIndices,int *partitionIndices,int partitionCount,
          double *outSumLogLikelihoodByPartition)

{
  long in_RCX;
  long in_RDX;
  BeagleCPUImpl<double,_1,_1> **in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  long in_stack_00000010;
  int in_stack_00000018;
  int i_1;
  unique_lock<std::mutex> l;
  threadData *td;
  packaged_task<void_()> threadTask;
  int partitionCountThread;
  int i;
  int threadsUsed;
  int currentPartitionIndex;
  int partitionsRemainder;
  int partitionsPerThreadFloor;
  mutex_type *__m;
  unique_lock<std::mutex> *this_00;
  shared_future<void> *__sf;
  packaged_task<void_()> *this_01;
  _Bind<void_(beagle::cpu::BeagleCPUImpl<double,_1,_1>::*(beagle::cpu::BeagleCPUImpl<double,_1,_1>_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*))(const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*)>
  *in_stack_fffffffffffffe68;
  packaged_task<void_()> *in_stack_fffffffffffffe70;
  int **in_stack_fffffffffffffe78;
  BeagleCPUImpl<double,_1,_1> **in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  int local_15c;
  int **in_stack_fffffffffffffec0;
  int **in_stack_fffffffffffffec8;
  int **in_stack_fffffffffffffed0;
  int **in_stack_fffffffffffffed8;
  element_type *in_stack_fffffffffffffee0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffee8;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  long local_e8;
  long local_e0;
  long local_d8;
  undefined8 local_c8;
  undefined8 local_c0;
  int *local_b8 [12];
  BeagleCPUImpl<double,_1,_1> *local_58 [2];
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  BeagleCPUImpl<double,_1,_1> **local_10;
  
  local_34 = in_stack_00000018 / *(int *)(in_RDI + 0x138);
  local_38 = in_stack_00000018 % *(int *)(in_RDI + 0x138);
  local_3c = 0;
  if (*(int *)(in_RDI + 0x138) <= in_stack_00000018) {
    in_stack_00000018 = *(int *)(in_RDI + 0x138);
  }
  local_40 = in_stack_00000018;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  for (local_44 = 0; local_44 < local_40; local_44 = local_44 + 1) {
    local_48 = local_34;
    if (local_38 != 0) {
      local_48 = local_34 + 1;
      local_38 = local_38 + -1;
    }
    local_c0 = 0;
    local_c8 = 0x279;
    local_d8 = (long)local_10 + (long)local_3c * 4;
    local_e0 = local_18 + (long)local_3c * 4;
    local_e8 = local_20 + (long)local_3c * 4;
    local_f8._8_8_ = local_28 + (long)local_3c * 4;
    local_f8._0_8_ = local_30 + (long)local_3c * 4;
    local_108._8_8_ = in_stack_00000008 + (long)local_3c * 4;
    local_108._0_8_ = in_stack_00000010 + (long)local_3c * 4;
    this_01 = (packaged_task<void_()> *)local_108;
    __sf = (shared_future<void> *)(local_108 + 8);
    this_00 = (unique_lock<std::mutex> *)local_f8;
    __m = (mutex_type *)(local_f8 + 8);
    std::
    bind<void(beagle::cpu::BeagleCPUImpl<double,1,1>::*)(int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int,double*),beagle::cpu::BeagleCPUImpl<double,1,1>*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int&,double*>
              ((offset_in_BeagleCPUImpl<double,_1,_1>_to_subr *)
               CONCAT44(in_stack_00000018,in_stack_fffffffffffffe90),in_stack_fffffffffffffe88,
               local_b8,in_stack_fffffffffffffe78,(int **)in_stack_fffffffffffffe70,
               in_stack_fffffffffffffec0,in_stack_fffffffffffffec8,in_stack_fffffffffffffed0,
               in_stack_fffffffffffffed8,(int *)in_stack_fffffffffffffee0,
               (double **)in_stack_fffffffffffffee8._M_pi);
    in_stack_fffffffffffffe88 = local_58;
    std::packaged_task<void()>::
    packaged_task<std::_Bind<void(beagle::cpu::BeagleCPUImpl<double,1,1>::*(beagle::cpu::BeagleCPUImpl<double,1,1>*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int,double*))(int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int_const*,int,double*)>,void>
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    std::packaged_task<void_()>::get_future((packaged_task<void_()> *)in_stack_fffffffffffffe68);
    in_stack_fffffffffffffe70 = (packaged_task<void_()> *)&stack0xfffffffffffffee0;
    in_stack_fffffffffffffe78 = (int **)&stack0xfffffffffffffed0;
    std::shared_future<void>::shared_future((shared_future<void> *)this_00,(future<void> *)__m);
    std::shared_future<void>::operator=((shared_future<void> *)this_01,__sf);
    std::shared_future<void>::~shared_future((shared_future<void> *)0x1a6499);
    std::future<void>::~future((future<void> *)0x1a64a3);
    std::unique_lock<std::mutex>::unique_lock(this_00,__m);
    in_RSI = local_58;
    std::
    queue<std::packaged_task<void_()>,_std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>_>
    ::push((queue<std::packaged_task<void_()>,_std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>_>
            *)this_00,(value_type *)__m);
    std::unique_lock<std::mutex>::unlock(this_00);
    std::condition_variable::notify_one();
    local_3c = local_48 + local_3c;
    std::unique_lock<std::mutex>::~unique_lock(this_00);
    std::packaged_task<void_()>::~packaged_task(this_01);
  }
  for (local_15c = 0; local_15c < *(int *)(in_RDI + 0x138); local_15c = local_15c + 1) {
    std::__basic_future<void>::wait
              ((__basic_future<void> *)(*(long *)(in_RDI + 0x170) + (long)local_15c * 0x10),in_RSI);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
    void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsByPartitionAsync(
                                                        const int* parentBufferIndices,
                                                        const int* childBufferIndices,
                                                        const int* probabilityIndices,
                                                        const int* categoryWeightsIndices,
                                                        const int* stateFrequenciesIndices,
                                                        const int* cumulativeScaleIndices,
                                                        const int* partitionIndices,
                                                        int partitionCount,
                                                        double* outSumLogLikelihoodByPartition) {

    int partitionsPerThreadFloor = partitionCount / kNumThreads;
    int partitionsRemainder = partitionCount % kNumThreads;
    int currentPartitionIndex = 0;
    int threadsUsed = (partitionCount < kNumThreads ? partitionCount : kNumThreads);
    for (int i=0; i<threadsUsed; i++) {
        int partitionCountThread = partitionsPerThreadFloor;
        if (partitionsRemainder) {
            partitionCountThread++;
            partitionsRemainder--;
        }

        std::packaged_task<void()> threadTask(
            std::bind(&BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsByPartition, this,
                      &parentBufferIndices[currentPartitionIndex],
                      &childBufferIndices[currentPartitionIndex],
                      &probabilityIndices[currentPartitionIndex],
                      &categoryWeightsIndices[currentPartitionIndex],
                      &stateFrequenciesIndices[currentPartitionIndex],
                      &cumulativeScaleIndices[currentPartitionIndex],
                      &partitionIndices[currentPartitionIndex],
                      partitionCountThread,
                      &outSumLogLikelihoodByPartition[currentPartitionIndex]));

        gFutures[i] = threadTask.get_future();
        threadData* td = &gThreads[i];

        std::unique_lock<std::mutex> l(td->m);
        td->jobs.push(std::move(threadTask));
        l.unlock();

        gThreads[i].cv.notify_one();

        currentPartitionIndex += partitionCountThread;
    }

    for (int i=0; i<kNumThreads; i++) {
        gFutures[i].wait();
    }

}